

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

number_validator<float> __thiscall goodform::sub_form::float32(sub_form *this)

{
  bool bVar1;
  undefined8 *in_RSI;
  number_validator<float> nVar2;
  float val;
  allocator<char> local_5d;
  float local_5c;
  string local_58;
  error_message local_38;
  
  bVar1 = convert<float>((any *)in_RSI[1],&local_5c);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"NOT A float32",&local_5d);
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  this->error_ = (error_message *)*in_RSI;
  *(float *)&this->variant_ = local_5c;
  nVar2.value_ = local_5c;
  nVar2.error_ = (error_message *)this;
  nVar2._12_4_ = 0;
  return nVar2;
}

Assistant:

number_validator<float> sub_form::float32()
  {
    float val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A float32");
    return number_validator<float>(val, this->error_);
  }